

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
int_writer<char,fmt::v6::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,char **it)

{
  int iVar1;
  char *__dest;
  bool bVar2;
  undefined1 *puVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ptrdiff_t _Num;
  size_t __n;
  undefined1 auStack_38 [32];
  
  uVar6 = *(uint *)this;
  iVar1 = *(int *)(this + 4);
  __n = (size_t)iVar1;
  puVar3 = auStack_38 + __n;
  uVar5 = uVar6;
  if (99 < uVar6) {
    do {
      uVar5 = uVar6 / 100;
      *(undefined2 *)(puVar3 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar6 % 100) * 2);
      puVar3 = puVar3 + -2;
      bVar2 = 9999 < uVar6;
      uVar6 = uVar6 / 100;
    } while (bVar2);
  }
  __dest = *it;
  if (uVar5 < 10) {
    bVar4 = (byte)uVar5 | 0x30;
    lVar7 = -1;
  }
  else {
    puVar3[-1] = basic_data<void>::digits[((ulong)uVar5 * 2 & 0xffffffff) + 1];
    bVar4 = basic_data<void>::digits[(ulong)uVar5 * 2];
    lVar7 = -2;
  }
  puVar3[lVar7] = bVar4;
  if (iVar1 != 0) {
    memcpy(__dest,auStack_38,__n);
  }
  *it = __dest + __n;
  return;
}

Assistant:

void operator()(It&& it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }